

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O3

void __thiscall CMenus::UpdateMusicState(CMenus *this)

{
  CGameClient *pCVar1;
  bool bVar2;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if (((pCVar1->m_pClient->m_State == 0) && (pCVar1->m_pConfig->m_SndEnable != 0)) &&
     (pCVar1->m_pConfig->m_SndMusic != 0)) {
    bVar2 = CSounds::IsPlaying(pCVar1->m_pSounds,0x28);
    if (!bVar2) {
      CSounds::Enqueue(((this->super_CComponent).m_pClient)->m_pSounds,1,0x28);
      return;
    }
  }
  else {
    bVar2 = CSounds::IsPlaying(pCVar1->m_pSounds,0x28);
    if (bVar2) {
      CSounds::Stop(((this->super_CComponent).m_pClient)->m_pSounds,0x28);
      return;
    }
  }
  return;
}

Assistant:

void CMenus::UpdateMusicState()
{
	bool ShouldPlay = Client()->State() == IClient::STATE_OFFLINE && Config()->m_SndEnable && Config()->m_SndMusic;
	if(ShouldPlay && !m_pClient->m_pSounds->IsPlaying(SOUND_MENU))
		m_pClient->m_pSounds->Enqueue(CSounds::CHN_MUSIC, SOUND_MENU);
	else if(!ShouldPlay && m_pClient->m_pSounds->IsPlaying(SOUND_MENU))
		m_pClient->m_pSounds->Stop(SOUND_MENU);
}